

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_short_test.cpp
# Opt level: O3

void __thiscall
reflect_value_cast_short_test_short_to_short_cast_Test::TestBody
          (reflect_value_cast_short_test_short_to_short_cast_Test *this)

{
  undefined2 uVar1;
  undefined8 uVar2;
  char *message;
  AssertHelper local_40;
  Message local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  uVar2 = value_create_short(0x783);
  uVar1 = value_to_short(uVar2);
  uVar2 = value_type_cast(uVar2,2);
  local_38.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_2_ = uVar1;
  local_40.data_._0_2_ = value_to_short(uVar2);
  testing::internal::CmpHelperEQ<short,short>
            (local_30,"(short)s","(short)value_to_short(v)",(short *)&local_38,(short *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_28 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_short_test.cpp"
               ,0x41,message);
    testing::internal::AssertHelper::operator=(&local_40,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT62(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._2_6_,
                         local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_2_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT62(local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._2_6_,
                                     local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_2_) + 8))();
    }
  }
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  value_destroy(uVar2);
  return;
}

Assistant:

TEST_F(reflect_value_cast_short_test, short_to_short_cast)
{
	value v = value_create_short(1923);

	short s = value_to_short(v);

	v = value_type_cast(v, TYPE_SHORT);

	EXPECT_EQ((short)s, (short)value_to_short(v));

	value_destroy(v);
}